

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadUInt
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *this,uint lb,uint ub)

{
  int value;
  uint local_1c;
  
  local_1c = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
  if (local_1c < lb || ub <= local_1c) {
    TextReader<fmt::Locale>::ReportError<int>(this->reader_,(CStringRef)0x21c08e,(int *)&local_1c);
  }
  return local_1c;
}

Assistant:

int ReadUInt(unsigned lb, unsigned ub) {
    int value = reader_.ReadUInt();
    unsigned unsigned_value = value;
    if (unsigned_value < lb || unsigned_value >= ub)
      reader_.ReportError("integer {} out of bounds", value);
    return value;
  }